

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O2

void __thiscall defyx_vm::initialize(defyx_vm *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2 = (this->program).entropyBuffer[0];
  uVar3 = (this->program).entropyBuffer[1];
  uVar8 = (this->program).entropyBuffer[2];
  uVar9 = (this->program).entropyBuffer[3];
  uVar6 = (this->program).entropyBuffer[4];
  uVar7 = (this->program).entropyBuffer[5];
  uVar4 = (this->program).entropyBuffer[6];
  uVar5 = (this->program).entropyBuffer[7];
  (this->reg).a[0].lo =
       (double)((uVar2 >> 7 & 0x1f0000000000000 | uVar2 & 0xfffffffffffff) + 0x3ff0000000000000);
  (this->reg).a[0].hi =
       (double)((uVar3 >> 7 & 0x1f0000000000000 | uVar3 & 0xfffffffffffff) + 0x3ff0000000000000);
  (this->reg).a[1].lo =
       (double)((uVar8 >> 7 & 0x1f0000000000000 | uVar8 & 0xfffffffffffff) + 0x3ff0000000000000);
  (this->reg).a[1].hi =
       (double)((uVar9 >> 7 & 0x1f0000000000000 | uVar9 & 0xfffffffffffff) + 0x3ff0000000000000);
  (this->reg).a[2].lo =
       (double)((uVar6 >> 7 & 0x1f0000000000000 | uVar6 & 0xfffffffffffff) + 0x3ff0000000000000);
  (this->reg).a[2].hi =
       (double)((uVar7 >> 7 & 0x1f0000000000000 | uVar7 & 0xfffffffffffff) + 0x3ff0000000000000);
  (this->reg).a[3].lo =
       (double)((uVar4 >> 7 & 0x1f0000000000000 | uVar4 & 0xfffffffffffff) + 0x3ff0000000000000);
  (this->reg).a[3].hi =
       (double)((uVar5 >> 7 & 0x1f0000000000000 | uVar5 & 0xfffffffffffff) + 0x3ff0000000000000);
  (this->mem).ma = (uint)(this->program).entropyBuffer[8] & 0x1ffffc0;
  (this->mem).mx = (addr_t)(this->program).entropyBuffer[10];
  uVar1 = (uint)(this->program).entropyBuffer[0xc];
  (this->config).readReg0 = uVar1 & 1;
  (this->config).readReg1 = uVar1 >> 1 & 1 | 2;
  (this->config).readReg2 = uVar1 >> 2 & 1 | 4;
  (this->config).readReg3 = uVar1 >> 3 & 1 | 6;
  this->datasetOffset = (ulong)(((uint)(this->program).entropyBuffer[0xd] & 0x7ffff) << 6);
  uVar2 = (this->program).entropyBuffer[0xe];
  uVar3 = (this->program).entropyBuffer[0xf];
  (this->config).eMask[0] = uVar2 >> 4 & 0xf00000000000000 | uVar2 & 0x3fffff | 0x3000000000000000;
  (this->config).eMask[1] = uVar3 >> 4 & 0xf00000000000000 | uVar3 & 0x3fffff | 0x3000000000000000;
  return;
}

Assistant:

static inline uint64_t getSmallPositiveFloatBits(uint64_t entropy) {
		auto exponent = entropy >> 59; //0..31
		auto mantissa = entropy & mantissaMask;
		exponent += exponentBias;
		exponent &= exponentMask;
		exponent <<= mantissaSize;
		return exponent | mantissa;
	}